

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvhz.cpp
# Opt level: O2

void UConverter_fromUnicode_HZ_OFFSETS_LOGIC(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  char cVar1;
  UChar UVar2;
  int32_t iVar3;
  long lVar4;
  uint uVar5;
  UConverter *pUVar6;
  uint uVar7;
  int iVar8;
  int32_t *piVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  long lVar12;
  UErrorCode UVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  char cVar17;
  uint32_t local_78;
  char local_71;
  char *local_70;
  long local_68;
  ulong local_60;
  UErrorCode *local_58;
  long *local_50;
  ulong local_48;
  long local_40;
  UChar *local_38;
  
  local_38 = args->source;
  local_70 = args->target;
  piVar9 = args->offsets;
  iVar15 = *(int *)&args->targetLimit - (int)local_70;
  local_48 = (ulong)((long)args->sourceLimit - (long)local_38) >> 1;
  pUVar6 = args->converter;
  local_50 = (long *)pUVar6->extraInfo;
  cVar17 = *(char *)((long)local_50 + 0x12);
  if ((pUVar6->fromUChar32 == 0) || (uVar7 = 0, iVar15 < 1)) {
    local_40 = (long)(int)local_48;
    local_68 = 0;
    local_58 = err;
    iVar16 = 0;
    do {
      lVar12 = (long)(int)local_68;
      while( true ) {
        iVar14 = (int)lVar12;
        if (local_40 <= lVar12) goto LAB_0016d900;
        local_78 = 0xffff;
        if (iVar15 <= iVar16) {
          *local_58 = U_BUFFER_OVERFLOW_ERROR;
          goto LAB_0016d900;
        }
        local_68 = lVar12 + 1;
        UVar2 = local_38[lVar12];
        local_60 = (ulong)(ushort)UVar2;
        uVar7 = (uint)(ushort)UVar2;
        uVar5 = (uint)(ushort)UVar2;
        if (uVar5 != 0x7e) break;
        for (lVar4 = 0; lVar12 = local_68, (int)lVar4 != 2; lVar4 = lVar4 + 1) {
          uVar10 = "~~"[lVar4];
          if (iVar16 < iVar15) {
            args->target[iVar16] = uVar10;
            if (args->offsets != (int32_t *)0x0) {
              *piVar9 = iVar14;
              piVar9 = piVar9 + 1;
            }
            iVar16 = iVar16 + 1;
          }
          else {
            pUVar6 = args->converter;
            cVar1 = pUVar6->charErrorBufferLength;
            pUVar6->charErrorBufferLength = cVar1 + '\x01';
            pUVar6->charErrorBuffer[cVar1] = uVar10;
            *local_58 = U_BUFFER_OVERFLOW_ERROR;
          }
        }
      }
      local_71 = cVar17;
      if (0x7f < (ushort)UVar2) {
        iVar3 = ucnv_MBCSFromUChar32_63
                          (*(UConverterSharedData **)(*local_50 + 0x30),(uint)(ushort)UVar2,
                           &local_78,args->converter->useFallback);
        uVar7 = (uint)local_60;
        iVar8 = (int)local_68;
        cVar17 = local_71;
        if (((iVar3 != 2) || (0x5c5d < (local_78 + 0x5e5f & 0xfffe))) ||
           (0x5d < (local_78 + 0x5f & 0xfe))) goto LAB_0016d924;
        uVar5 = local_78 - 0x8080;
      }
      iVar8 = (int)local_68;
      cVar17 = local_71;
      if (uVar5 == 0xffff) goto LAB_0016d924;
      cVar17 = 0xff < uVar5;
      *(char *)((long)local_50 + 0x12) = cVar17;
      if (((int)local_71 != (uint)(byte)cVar17) || ((char)local_50[2] == '\0')) {
        lVar12 = 0;
        if (uVar5 < 0x100) {
          for (; (int)lVar12 != 2; lVar12 = lVar12 + 1) {
            uVar10 = "~}"[lVar12];
            if (iVar16 < iVar15) {
              args->target[iVar16] = uVar10;
              if (args->offsets != (int32_t *)0x0) {
                *piVar9 = iVar14;
                piVar9 = piVar9 + 1;
              }
              iVar16 = iVar16 + 1;
            }
            else {
              pUVar6 = args->converter;
              cVar1 = pUVar6->charErrorBufferLength;
              pUVar6->charErrorBufferLength = cVar1 + '\x01';
              pUVar6->charErrorBuffer[cVar1] = uVar10;
              *local_58 = U_BUFFER_OVERFLOW_ERROR;
            }
          }
        }
        else {
          for (; (int)lVar12 != 2; lVar12 = lVar12 + 1) {
            uVar10 = "~{"[lVar12];
            if (iVar16 < iVar15) {
              args->target[iVar16] = uVar10;
              if (args->offsets != (int32_t *)0x0) {
                *piVar9 = iVar14;
                piVar9 = piVar9 + 1;
              }
              iVar16 = iVar16 + 1;
            }
            else {
              pUVar6 = args->converter;
              cVar1 = pUVar6->charErrorBufferLength;
              pUVar6->charErrorBufferLength = cVar1 + '\x01';
              pUVar6->charErrorBuffer[cVar1] = uVar10;
              *local_58 = U_BUFFER_OVERFLOW_ERROR;
            }
          }
        }
        *(undefined1 *)(local_50 + 2) = 1;
      }
      lVar12 = (long)iVar16;
      uVar10 = (uint8_t)uVar5;
      if (uVar5 < 0x100) {
        if (iVar15 <= iVar16) {
          pUVar6 = args->converter;
          cVar1 = pUVar6->charErrorBufferLength;
          pUVar6->charErrorBufferLength = cVar1 + '\x01';
          pUVar6->charErrorBuffer[cVar1] = uVar10;
          goto LAB_0016d880;
        }
        iVar16 = iVar16 + 1;
        local_70[lVar12] = uVar10;
LAB_0016d8a2:
        if (piVar9 == (int32_t *)0x0) {
          piVar9 = (int32_t *)0x0;
        }
        else {
          *piVar9 = iVar14;
          piVar9 = piVar9 + 1;
        }
      }
      else {
        uVar11 = (uint8_t)(uVar5 >> 8);
        if (iVar16 < iVar15) {
          local_70[lVar12] = uVar11;
          if (piVar9 == (int32_t *)0x0) {
            piVar9 = (int32_t *)0x0;
          }
          else {
            *piVar9 = iVar14;
            piVar9 = piVar9 + 1;
          }
          iVar8 = (int)(lVar12 + 1);
          if (iVar8 < iVar15) {
            iVar16 = iVar16 + 2;
            local_70[lVar12 + 1] = uVar10;
            goto LAB_0016d8a2;
          }
          pUVar6 = args->converter;
          cVar1 = pUVar6->charErrorBufferLength;
          pUVar6->charErrorBufferLength = cVar1 + '\x01';
          pUVar6->charErrorBuffer[cVar1] = uVar10;
          *local_58 = U_BUFFER_OVERFLOW_ERROR;
          iVar16 = iVar8;
        }
        else {
          pUVar6 = args->converter;
          cVar1 = pUVar6->charErrorBufferLength;
          pUVar6->charErrorBufferLength = cVar1 + '\x01';
          pUVar6->charErrorBuffer[cVar1] = uVar11;
          pUVar6 = args->converter;
          cVar1 = pUVar6->charErrorBufferLength;
          pUVar6->charErrorBufferLength = cVar1 + '\x01';
          pUVar6->charErrorBuffer[cVar1] = uVar10;
LAB_0016d880:
          *local_58 = U_BUFFER_OVERFLOW_ERROR;
        }
      }
    } while( true );
  }
  iVar16 = 0;
  iVar14 = 0;
  uVar5 = pUVar6->fromUChar32;
LAB_0016d582:
  UVar13 = U_ILLEGAL_CHAR_FOUND;
  local_58 = err;
  if (iVar14 < (int)local_48) {
    lVar12 = (long)iVar14;
    if (((ushort)args->source[lVar12] & 0xfc00) == 0xdc00) {
      iVar14 = iVar14 + 1;
      uVar7 = uVar5 * 0x400 + (uint)(ushort)args->source[lVar12] + 0xfca02400;
      pUVar6->fromUChar32 = 0;
      UVar13 = U_INVALID_CHAR_FOUND;
    }
  }
  else {
    UVar13 = U_ZERO_ERROR;
  }
LAB_0016d8f6:
  *local_58 = UVar13;
  args->converter->fromUChar32 = uVar7;
LAB_0016d900:
  args->target = args->target + iVar16;
  args->source = args->source + iVar14;
  *(char *)((long)local_50 + 0x12) = cVar17;
  return;
LAB_0016d924:
  iVar14 = iVar8;
  if ((uVar7 & 0xf800) != 0xd800) {
    UVar13 = U_INVALID_CHAR_FOUND;
    goto LAB_0016d8f6;
  }
  if ((uVar7 >> 10 & 1) != 0) {
    UVar13 = U_ILLEGAL_CHAR_FOUND;
    goto LAB_0016d8f6;
  }
  pUVar6 = args->converter;
  pUVar6->fromUChar32 = uVar7;
  err = local_58;
  uVar5 = uVar7;
  goto LAB_0016d582;
}

Assistant:

static void  U_CALLCONV
UConverter_fromUnicode_HZ_OFFSETS_LOGIC (UConverterFromUnicodeArgs * args,
                                                      UErrorCode * err){
    const UChar *mySource = args->source;
    char *myTarget = args->target;
    int32_t* offsets = args->offsets;
    int32_t mySourceIndex = 0;
    int32_t myTargetIndex = 0;
    int32_t targetLength = (int32_t)(args->targetLimit - myTarget);
    int32_t mySourceLength = (int32_t)(args->sourceLimit - args->source);
    uint32_t targetUniChar = 0x0000;
    UChar32 mySourceChar = 0x0000;
    UConverterDataHZ *myConverterData=(UConverterDataHZ*)args->converter->extraInfo;
    UBool isTargetUCharDBCS = (UBool) myConverterData->isTargetUCharDBCS;
    UBool oldIsTargetUCharDBCS;
    int len =0;
    const char* escSeq=NULL;
    
    /* Calling code already handles this situation. */
    /*if ((args->converter == NULL) || (args->targetLimit < myTarget) || (args->sourceLimit < args->source)){
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }*/
    if(args->converter->fromUChar32!=0 && myTargetIndex < targetLength) {
        goto getTrail;
    }
    /*writing the char to the output stream */
    while (mySourceIndex < mySourceLength){
        targetUniChar = missingCharMarker;
        if (myTargetIndex < targetLength){
            
            mySourceChar = (UChar) mySource[mySourceIndex++];
            

            oldIsTargetUCharDBCS = isTargetUCharDBCS;
            if(mySourceChar ==UCNV_TILDE){
                /*concatEscape(args, &myTargetIndex, &targetLength,"\x7E\x7E",err,2,&mySourceIndex);*/
                len = ESC_LEN;
                escSeq = TILDE_ESCAPE;
                CONCAT_ESCAPE_MACRO(args, myTargetIndex, targetLength, escSeq,err,len,mySourceIndex);
                continue;
            } else if(mySourceChar <= 0x7f) {
                targetUniChar = mySourceChar;
            } else {
                int32_t length= ucnv_MBCSFromUChar32(myConverterData->gbConverter->sharedData,
                    mySourceChar,&targetUniChar,args->converter->useFallback);
                /* we can only use lead bytes 21..7D and trail bytes 21..7E */
                if( length == 2 &&
                    (uint16_t)(targetUniChar - 0xa1a1) <= (0xfdfe - 0xa1a1) &&
                    (uint8_t)(targetUniChar - 0xa1) <= (0xfe - 0xa1)
                ) {
                    targetUniChar -= 0x8080;
                } else {
                    targetUniChar = missingCharMarker;
                }
            }
            if (targetUniChar != missingCharMarker){
               myConverterData->isTargetUCharDBCS = isTargetUCharDBCS = (UBool)(targetUniChar>0x00FF);     
                 if(oldIsTargetUCharDBCS != isTargetUCharDBCS || !myConverterData->isEscapeAppended ){
                    /*Shifting from a double byte to single byte mode*/
                    if(!isTargetUCharDBCS){
                        len =ESC_LEN;
                        escSeq = SB_ESCAPE;
                        CONCAT_ESCAPE_MACRO(args, myTargetIndex, targetLength, escSeq,err,len,mySourceIndex);
                        myConverterData->isEscapeAppended = TRUE;
                    }
                    else{ /* Shifting from a single byte to double byte mode*/
                        len =ESC_LEN;
                        escSeq = DB_ESCAPE;
                        CONCAT_ESCAPE_MACRO(args, myTargetIndex, targetLength, escSeq,err,len,mySourceIndex);
                        myConverterData->isEscapeAppended = TRUE;
                        
                    }
                }
            
                if(isTargetUCharDBCS){
                    if( myTargetIndex <targetLength){
                        myTarget[myTargetIndex++] =(char) (targetUniChar >> 8);
                        if(offsets){
                            *(offsets++) = mySourceIndex-1;
                        }
                        if(myTargetIndex < targetLength){
                            myTarget[myTargetIndex++] =(char) targetUniChar;
                            if(offsets){
                                *(offsets++) = mySourceIndex-1;
                            }
                        }else{
                            args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (char) targetUniChar;
                            *err = U_BUFFER_OVERFLOW_ERROR;
                        } 
                    }else{
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] =(char) (targetUniChar >> 8);
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (char) targetUniChar;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }

                }else{
                    if( myTargetIndex <targetLength){
                        myTarget[myTargetIndex++] = (char) (targetUniChar );
                        if(offsets){
                            *(offsets++) = mySourceIndex-1;
                        }
                        
                    }else{
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (char) targetUniChar;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }

            }
            else{
                /* oops.. the code point is unassigned */
                /*Handle surrogates */
                /*check if the char is a First surrogate*/
                if(U16_IS_SURROGATE(mySourceChar)) {
                    if(U16_IS_SURROGATE_LEAD(mySourceChar)) {
                        args->converter->fromUChar32=mySourceChar;
getTrail:
                        /*look ahead to find the trail surrogate*/
                        if(mySourceIndex <  mySourceLength) {
                            /* test the following code unit */
                            UChar trail=(UChar) args->source[mySourceIndex];
                            if(U16_IS_TRAIL(trail)) {
                                ++mySourceIndex;
                                mySourceChar=U16_GET_SUPPLEMENTARY(args->converter->fromUChar32, trail);
                                args->converter->fromUChar32=0x00;
                                /* there are no surrogates in GB2312*/
                                *err = U_INVALID_CHAR_FOUND;
                                /* exit this condition tree */
                            } else {
                                /* this is an unmatched lead code unit (1st surrogate) */
                                /* callback(illegal) */
                                *err=U_ILLEGAL_CHAR_FOUND;
                            }
                        } else {
                            /* no more input */
                            *err = U_ZERO_ERROR;
                        }
                    } else {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        *err=U_ILLEGAL_CHAR_FOUND;
                    }
                } else {
                    /* callback(unassigned) for a BMP code point */
                    *err = U_INVALID_CHAR_FOUND;
                }

                args->converter->fromUChar32=mySourceChar;
                break;
            }
        }
        else{
            *err = U_BUFFER_OVERFLOW_ERROR;
            break;
        }
        targetUniChar=missingCharMarker;
    }

    args->target += myTargetIndex;
    args->source += mySourceIndex;
    myConverterData->isTargetUCharDBCS = isTargetUCharDBCS;
}